

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadMaterialLibrary(ColladaParser *this)

{
  MaterialLibrary *this_00;
  _func_int *p_Var1;
  size_type sVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mapped_type *pmVar5;
  iterator iVar6;
  long *plVar7;
  mapped_type_conflict1 *pmVar8;
  undefined4 extraout_var_02;
  long *plVar9;
  _Rb_tree_color _Var10;
  string name;
  string id;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  names;
  ostringstream strStream;
  key_type local_258;
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  key_type local_218;
  long *local_1f8 [2];
  long local_1e8 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_1d8;
  string local_1a8;
  long *local_188;
  undefined8 uStack_180;
  long local_178 [8];
  ios_base local_138 [264];
  
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar3 == '\0') {
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1d8._M_impl.super__Rb_tree_header._M_header;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_00 = &this->mMaterialLibrary;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      while( true ) {
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((char)iVar3 == '\0') goto LAB_0040ca61;
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        p_Var1 = this->mReader->_vptr_IIrrXMLReader[3];
        if (iVar3 != 1) break;
        iVar3 = (*p_Var1)();
        if (iVar3 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"material");
        if (iVar3 == 0) {
          uVar4 = GetAttribute(this,"id");
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar4);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_218,(char *)CONCAT44(extraout_var_00,iVar3),
                     (allocator<char> *)&local_1a8);
          local_258._M_string_length = 0;
          local_258.field_2._M_local_buf[0] = '\0';
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          iVar3 = TestAttribute(this,"name");
          if (-1 < iVar3) {
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])();
            sVar2 = local_258._M_string_length;
            strlen((char *)CONCAT44(extraout_var_01,iVar3));
            std::__cxx11::string::_M_replace
                      ((ulong)&local_258,0,(char *)sVar2,CONCAT44(extraout_var_01,iVar3));
          }
          local_1a8.field_2._8_8_ = 0;
          local_178[1] = 0;
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          local_1a8._M_string_length = 0;
          local_1a8.field_2._M_allocated_capacity = 0;
          uStack_180 = 0;
          local_178[0] = 0;
          local_188 = local_178;
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>_>
                   ::operator[](this_00,&local_218);
          std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_1a8);
          std::__cxx11::string::operator=((string *)&pmVar5->mEffect,(string *)&local_188);
          if (local_188 != local_178) {
            operator_delete(local_188,local_178[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if ((char *)local_258._M_string_length != (char *)0x0) {
            iVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::find(&local_1d8,&local_258);
            if ((_Rb_tree_header *)iVar6._M_node == &local_1d8._M_impl.super__Rb_tree_header) {
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                     *)&local_1d8,&local_258);
              *pmVar8 = 0;
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              _Var10 = iVar6._M_node[2]._M_color + _S_black;
              iVar6._M_node[2]._M_color = _Var10;
              std::ostream::operator<<(&local_1a8,_Var10);
              std::__cxx11::stringbuf::str();
              plVar7 = (long *)std::__cxx11::string::replace
                                         ((ulong)local_1f8,0,(char *)0x0,0x73d082);
              local_238 = &local_228;
              plVar9 = plVar7 + 2;
              if ((long *)*plVar7 == plVar9) {
                local_228 = *plVar9;
                lStack_220 = plVar7[3];
              }
              else {
                local_228 = *plVar9;
                local_238 = (long *)*plVar7;
              }
              local_230 = plVar7[1];
              *plVar7 = (long)plVar9;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_238);
              if (local_238 != &local_228) {
                operator_delete(local_238,local_228 + 1);
              }
              if (local_1f8[0] != local_1e8) {
                operator_delete(local_1f8[0],local_1e8[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              std::ios_base::~ios_base(local_138);
            }
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>_>
                     ::operator[](this_00,&local_218);
            std::__cxx11::string::_M_assign((string *)pmVar5);
          }
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>_>
                   ::operator[](this_00,&local_218);
          ReadMaterial(this,pmVar5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,
                            CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                     local_258.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          SkipElement(this);
        }
      }
      iVar3 = (*p_Var1)();
    } while (iVar3 != 2);
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar3 = strcmp((char *)CONCAT44(extraout_var_02,iVar3),"library_materials");
    if (iVar3 != 0) {
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a8,"Expected end of <library_materials> element.","");
      ThrowException(this,&local_1a8);
    }
LAB_0040ca61:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(&local_1d8);
  }
  return;
}

Assistant:

void ColladaParser::ReadMaterialLibrary()
{
    if (mReader->isEmptyElement())
        return;

    std::map<std::string, int> names;
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("material"))
            {
                // read ID. By now you probably know my opinion about this "specification"
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                std::string name;
                int attrName = TestAttribute("name");
                if (attrName >= 0)
                    name = mReader->getAttributeValue(attrName);

                // create an entry and store it in the library under its ID
                mMaterialLibrary[id] = Material();

                if (!name.empty())
                {
                    std::map<std::string, int>::iterator it = names.find(name);
                    if (it != names.end())
                    {
                        std::ostringstream strStream;
                        strStream << ++it->second;
                        name.append(" " + strStream.str());
                    }
                    else
                    {
                        names[name] = 0;
                    }

                    mMaterialLibrary[id].mName = name;
                }

                ReadMaterial(mMaterialLibrary[id]);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "library_materials") != 0)
                ThrowException("Expected end of <library_materials> element.");

            break;
        }
    }
}